

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall clip_model_loader::load_tensors(clip_model_loader *this)

{
  bool bVar1;
  byte bVar2;
  pointer pgVar3;
  long lVar4;
  long lVar5;
  mapped_type *pmVar6;
  runtime_error *prVar7;
  ggml_tensor *pgVar8;
  pointer pgVar9;
  pointer pgVar10;
  uchar *puVar11;
  undefined8 uVar12;
  long in_RDI;
  size_t num_bytes;
  size_t offset;
  ggml_tensor *cur;
  ggml_tensor **t;
  iterator __end2;
  iterator __begin2;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range2;
  ggml_backend_buffer_type_t buft;
  ifstream fin;
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_buf;
  value_type *layer;
  int il;
  clip_vision_model *vision_model;
  anon_class_16_2_dbf8b9d2 get_tensor;
  ggml_init_params params;
  char *name;
  int64_t i;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> tensors_to_load;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  tensor_offset;
  pointer __p;
  undefined4 in_stack_ffffffffffffe990;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffe994;
  undefined4 uVar14;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffe9a0;
  size_type in_stack_ffffffffffffe9a8;
  undefined7 in_stack_ffffffffffffe9b0;
  undefined1 in_stack_ffffffffffffe9b7;
  allocator<char> *in_stack_ffffffffffffe9c0;
  undefined7 in_stack_ffffffffffffe9c8;
  byte in_stack_ffffffffffffe9cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9d0;
  undefined8 in_stack_ffffffffffffe9e0;
  undefined1 required;
  string *in_stack_ffffffffffffe9e8;
  anon_class_16_2_dbf8b9d2 *in_stack_ffffffffffffe9f0;
  string local_1188 [39];
  allocator<char> local_1161;
  string local_1160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1140;
  size_type local_1138;
  reference local_1130;
  ggml_tensor **local_1128;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_1120;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_1118;
  undefined8 local_1110;
  undefined1 local_1101;
  string local_1100 [32];
  long local_10e0 [68];
  allocator<char> local_eb9;
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [39];
  allocator<char> local_e11;
  string local_e10 [39];
  allocator<char> local_de9;
  string local_de8 [39];
  allocator<char> local_dc1;
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [39];
  allocator<char> local_a59;
  string local_a58 [39];
  allocator<char> local_a31;
  string local_a30 [39];
  allocator<char> local_a09;
  string local_a08 [39];
  allocator<char> local_9e1;
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  reference local_258;
  uint local_24c;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [32];
  long local_108;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_f8;
  undefined1 local_e9;
  string local_e8 [32];
  pointer local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  allocator<char> local_91;
  string local_90 [32];
  undefined8 local_70;
  long local_58;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> local_50 [3];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x1cb6cc);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x1cb6d9);
  local_58 = 0;
  while( true ) {
    lVar5 = local_58;
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                        CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990));
    lVar4 = gguf_get_n_tensors(pgVar3);
    if (lVar4 <= lVar5) break;
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                        CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990));
    local_70 = gguf_get_tensor_name(pgVar3,local_58);
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                        CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990));
    lVar5 = gguf_get_data_offset(pgVar3);
    pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                        CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990));
    lVar4 = gguf_get_tensor_offset(pgVar3,local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_ffffffffffffe9d0,
                          (key_type *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8))
    ;
    *pmVar6 = lVar5 + lVar4;
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    local_58 = local_58 + 1;
  }
  pgVar3 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                     ((unique_ptr<gguf_context,_gguf_context_deleter> *)
                      CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990));
  lVar5 = gguf_get_n_tensors(pgVar3);
  lVar4 = ggml_tensor_overhead();
  local_c8 = (pointer)((lVar5 + 1) * lVar4);
  uStack_a8 = 0;
  local_a0 = 1;
  local_b8 = CONCAT71(uStack_9f,1);
  uStack_c0 = 0;
  uStack_c0._0_4_ = 0;
  uStack_c0._4_4_ = 0;
  uVar13 = (undefined4)uStack_c0;
  uVar14 = uStack_c0._4_4_;
  __p = local_c8;
  ggml_init();
  std::unique_ptr<ggml_context,_ggml_context_deleter>::reset
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar14,uVar13),__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ggml_context,_ggml_context_deleter> *)0x1cb9f8);
  if (!bVar1) {
    local_e9 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_((char *)local_e8,"%s: failed to init ggml context\n","load_tensors");
    std::runtime_error::runtime_error(prVar7,local_e8);
    local_e9 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f8 = local_50;
  local_108 = *(long *)(in_RDI + 0x10) + 0x10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,
             (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
             in_stack_ffffffffffffe9c0);
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0x88) = pgVar8;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  string_format_abi_cxx11_((char *)local_150,"%s.pre_ln.%s","v","weight");
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xb0) = pgVar8;
  std::__cxx11::string::~string(local_150);
  string_format_abi_cxx11_((char *)local_170,"%s.pre_ln.%s","v","bias");
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xb8) = pgVar8;
  std::__cxx11::string::~string(local_170);
  string_format_abi_cxx11_((char *)local_190,"%s.post_ln.%s","v","weight");
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xd8) = pgVar8;
  std::__cxx11::string::~string(local_190);
  string_format_abi_cxx11_((char *)local_1b0,"%s.post_ln.%s","v","bias");
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xe0) = pgVar8;
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,
             (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
             in_stack_ffffffffffffe9c0);
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xa0) = pgVar8;
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,
             (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
             in_stack_ffffffffffffe9c0);
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0x90) = pgVar8;
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,
             (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
             in_stack_ffffffffffffe9c0);
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0x98) = pgVar8;
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  if (*(long *)(local_108 + 0x98) == 0) {
    *(undefined1 *)(*(long *)(in_RDI + 0x10) + 5) = 0;
  }
  string_format_abi_cxx11_((char *)local_248,"%s.position_embd.weight","v");
  pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                     (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                      SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
  *(ggml_tensor **)(local_108 + 0xa8) = pgVar8;
  std::__cxx11::string::~string(local_248);
  std::vector<clip_layer,_std::allocator<clip_layer>_>::resize
            ((vector<clip_layer,_std::allocator<clip_layer>_> *)
             CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0),in_stack_ffffffffffffe9a8
            );
  for (local_24c = 0; required = (undefined1)((ulong)in_stack_ffffffffffffe9e0 >> 0x38),
      (int)local_24c < *(int *)(local_108 + 0x18); local_24c = local_24c + 1) {
    local_258 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                          ((vector<clip_layer,_std::allocator<clip_layer>_> *)(local_108 + 0xc0),
                           (long)(int)local_24c);
    string_format_abi_cxx11_((char *)local_278,"%s.blk.%d.attn_k.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->k_w = pgVar8;
    std::__cxx11::string::~string(local_278);
    string_format_abi_cxx11_((char *)local_298,"%s.blk.%d.attn_q.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->q_w = pgVar8;
    std::__cxx11::string::~string(local_298);
    string_format_abi_cxx11_((char *)local_2b8,"%s.blk.%d.attn_v.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->v_w = pgVar8;
    std::__cxx11::string::~string(local_2b8);
    string_format_abi_cxx11_
              ((char *)local_2d8,"%s.blk.%d.attn_out.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->o_w = pgVar8;
    std::__cxx11::string::~string(local_2d8);
    string_format_abi_cxx11_((char *)local_2f8,"%s.blk.%d.ln1.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ln_1_w = pgVar8;
    std::__cxx11::string::~string(local_2f8);
    string_format_abi_cxx11_((char *)local_318,"%s.blk.%d.ln2.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ln_2_w = pgVar8;
    std::__cxx11::string::~string(local_318);
    string_format_abi_cxx11_((char *)local_338,"%s.blk.%d.attn_k.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->k_b = pgVar8;
    std::__cxx11::string::~string(local_338);
    string_format_abi_cxx11_((char *)local_358,"%s.blk.%d.attn_q.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->q_b = pgVar8;
    std::__cxx11::string::~string(local_358);
    string_format_abi_cxx11_((char *)local_378,"%s.blk.%d.attn_v.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->v_b = pgVar8;
    std::__cxx11::string::~string(local_378);
    string_format_abi_cxx11_((char *)local_398,"%s.blk.%d.attn_out.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->o_b = pgVar8;
    std::__cxx11::string::~string(local_398);
    string_format_abi_cxx11_((char *)local_3b8,"%s.blk.%d.ln1.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ln_1_b = pgVar8;
    std::__cxx11::string::~string(local_3b8);
    string_format_abi_cxx11_((char *)local_3d8,"%s.blk.%d.ln2.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ln_2_b = pgVar8;
    std::__cxx11::string::~string(local_3d8);
    string_format_abi_cxx11_((char *)local_3f8,"%s.blk.%d.ffn_up.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_up_w = pgVar8;
    std::__cxx11::string::~string(local_3f8);
    string_format_abi_cxx11_((char *)local_418,"%s.blk.%d.ffn_up.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_up_b = pgVar8;
    std::__cxx11::string::~string(local_418);
    string_format_abi_cxx11_
              ((char *)local_438,"%s.blk.%d.ffn_gate.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_gate_w = pgVar8;
    std::__cxx11::string::~string(local_438);
    string_format_abi_cxx11_((char *)local_458,"%s.blk.%d.ffn_gate.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_gate_b = pgVar8;
    std::__cxx11::string::~string(local_458);
    string_format_abi_cxx11_
              ((char *)local_478,"%s.blk.%d.ffn_down.%s","v",(ulong)local_24c,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_down_w = pgVar8;
    std::__cxx11::string::~string(local_478);
    string_format_abi_cxx11_((char *)local_498,"%s.blk.%d.ffn_down.%s","v",(ulong)local_24c,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                        SUB81((ulong)in_stack_ffffffffffffe9e0 >> 0x38,0));
    local_258->ff_down_b = pgVar8;
    std::__cxx11::string::~string(local_498);
    local_258->ff_i_w = local_258->ff_down_w;
    local_258->ff_o_w = local_258->ff_up_w;
    local_258->ff_i_b = local_258->ff_down_b;
    local_258->ff_o_b = local_258->ff_up_b;
  }
  switch(*(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x300)) {
  case 0:
  case 1:
    string_format_abi_cxx11_((char *)local_4b8,"mm.%d.%s",0,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0xf0) = pgVar8;
    std::__cxx11::string::~string(local_4b8);
    string_format_abi_cxx11_((char *)local_4d8,"mm.%d.%s",0,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0xf8) = pgVar8;
    std::__cxx11::string::~string(local_4d8);
    string_format_abi_cxx11_((char *)local_4f8,"mm.%d.%s",1,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x118) = pgVar8;
    std::__cxx11::string::~string(local_4f8);
    string_format_abi_cxx11_((char *)local_518,"mm.%d.%s",1,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x120) = pgVar8;
    std::__cxx11::string::~string(local_518);
    string_format_abi_cxx11_((char *)local_538,"mm.%d.%s",2,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x100) = pgVar8;
    std::__cxx11::string::~string(local_538);
    string_format_abi_cxx11_((char *)local_558,"mm.%d.%s",2,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x108) = pgVar8;
    std::__cxx11::string::~string(local_558);
    string_format_abi_cxx11_((char *)local_578,"mm.%d.%s",3,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x128) = pgVar8;
    std::__cxx11::string::~string(local_578);
    string_format_abi_cxx11_((char *)local_598,"mm.%d.%s",3,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x130) = pgVar8;
    std::__cxx11::string::~string(local_598);
    string_format_abi_cxx11_((char *)local_5b8,"mm.%d.%s",4,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x138) = pgVar8;
    std::__cxx11::string::~string(local_5b8);
    string_format_abi_cxx11_((char *)local_5d8,"mm.%d.%s",4,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x140) = pgVar8;
    std::__cxx11::string::~string(local_5d8);
    if (*(long *)(local_108 + 0x128) != 0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x300) = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x110) = pgVar8;
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    break;
  case 2:
    string_format_abi_cxx11_((char *)local_620,"mm.model.mlp.%d.%s",1,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x158) = pgVar8;
    std::__cxx11::string::~string(local_620);
    string_format_abi_cxx11_((char *)local_640,"mm.model.mlp.%d.%s",1,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x160) = pgVar8;
    std::__cxx11::string::~string(local_640);
    string_format_abi_cxx11_((char *)local_660,"mm.model.mlp.%d.%s",3,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x168) = pgVar8;
    std::__cxx11::string::~string(local_660);
    string_format_abi_cxx11_((char *)local_680,"mm.model.mlp.%d.%s",3,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x170) = pgVar8;
    std::__cxx11::string::~string(local_680);
    string_format_abi_cxx11_((char *)local_6a0,"mm.model.mb_block.%d.block.%d.%s",1,0,"0.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x178) = pgVar8;
    std::__cxx11::string::~string(local_6a0);
    string_format_abi_cxx11_((char *)local_6c0,"mm.model.mb_block.%d.block.%d.%s",1,0,"1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x180) = pgVar8;
    std::__cxx11::string::~string(local_6c0);
    string_format_abi_cxx11_((char *)local_6e0,"mm.model.mb_block.%d.block.%d.%s",1,0,"1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x188) = pgVar8;
    std::__cxx11::string::~string(local_6e0);
    string_format_abi_cxx11_((char *)local_700,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 400) = pgVar8;
    std::__cxx11::string::~string(local_700);
    string_format_abi_cxx11_((char *)local_720,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x198) = pgVar8;
    std::__cxx11::string::~string(local_720);
    string_format_abi_cxx11_((char *)local_740,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc2.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1a0) = pgVar8;
    std::__cxx11::string::~string(local_740);
    string_format_abi_cxx11_((char *)local_760,"mm.model.mb_block.%d.block.%d.%s",1,1,"fc2.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1a8) = pgVar8;
    std::__cxx11::string::~string(local_760);
    string_format_abi_cxx11_((char *)local_780,"mm.model.mb_block.%d.block.%d.%s",1,2,"0.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1b0) = pgVar8;
    std::__cxx11::string::~string(local_780);
    string_format_abi_cxx11_((char *)local_7a0,"mm.model.mb_block.%d.block.%d.%s",1,2,"1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1b8) = pgVar8;
    std::__cxx11::string::~string(local_7a0);
    string_format_abi_cxx11_((char *)local_7c0,"mm.model.mb_block.%d.block.%d.%s",1,2,"1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1c0) = pgVar8;
    std::__cxx11::string::~string(local_7c0);
    string_format_abi_cxx11_((char *)local_7e0,"mm.model.mb_block.%d.block.%d.%s",2,0,"0.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1c8) = pgVar8;
    std::__cxx11::string::~string(local_7e0);
    string_format_abi_cxx11_((char *)local_800,"mm.model.mb_block.%d.block.%d.%s",2,0,"1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1d0) = pgVar8;
    std::__cxx11::string::~string(local_800);
    string_format_abi_cxx11_((char *)local_820,"mm.model.mb_block.%d.block.%d.%s",2,0,"1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1d8) = pgVar8;
    std::__cxx11::string::~string(local_820);
    string_format_abi_cxx11_((char *)local_840,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1e0) = pgVar8;
    std::__cxx11::string::~string(local_840);
    string_format_abi_cxx11_((char *)local_860,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1e8) = pgVar8;
    std::__cxx11::string::~string(local_860);
    string_format_abi_cxx11_((char *)local_880,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc2.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1f0) = pgVar8;
    std::__cxx11::string::~string(local_880);
    string_format_abi_cxx11_((char *)local_8a0,"mm.model.mb_block.%d.block.%d.%s",2,1,"fc2.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x1f8) = pgVar8;
    std::__cxx11::string::~string(local_8a0);
    string_format_abi_cxx11_((char *)local_8c0,"mm.model.mb_block.%d.block.%d.%s",2,2,"0.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x200) = pgVar8;
    std::__cxx11::string::~string(local_8c0);
    string_format_abi_cxx11_((char *)local_8e0,"mm.model.mb_block.%d.block.%d.%s",2,2,"1.weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x208) = pgVar8;
    std::__cxx11::string::~string(local_8e0);
    string_format_abi_cxx11_((char *)local_900,"mm.model.mb_block.%d.block.%d.%s",2,2,"1.bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x210) = pgVar8;
    std::__cxx11::string::~string(local_900);
    break;
  case 3:
    string_format_abi_cxx11_((char *)local_920,"mm.model.mlp.%d.%s",0,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x218) = pgVar8;
    std::__cxx11::string::~string(local_920);
    string_format_abi_cxx11_((char *)local_940,"mm.model.mlp.%d.%s",0,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x220) = pgVar8;
    std::__cxx11::string::~string(local_940);
    string_format_abi_cxx11_((char *)local_960,"mm.model.mlp.%d.%s",2,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x228) = pgVar8;
    std::__cxx11::string::~string(local_960);
    string_format_abi_cxx11_((char *)local_980,"mm.model.mlp.%d.%s",2,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x230) = pgVar8;
    std::__cxx11::string::~string(local_980);
    string_format_abi_cxx11_((char *)local_9a0,"mm.model.peg.%d.%s",0,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x238) = pgVar8;
    std::__cxx11::string::~string(local_9a0);
    string_format_abi_cxx11_((char *)local_9c0,"mm.model.peg.%d.%s",0,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x240) = pgVar8;
    std::__cxx11::string::~string(local_9c0);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x248) = pgVar8;
    std::__cxx11::string::~string(local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x250) = pgVar8;
    std::__cxx11::string::~string(local_a08);
    std::allocator<char>::~allocator(&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 600) = pgVar8;
    std::__cxx11::string::~string(local_a30);
    std::allocator<char>::~allocator(&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x260) = pgVar8;
    std::__cxx11::string::~string(local_a58);
    std::allocator<char>::~allocator(&local_a59);
    string_format_abi_cxx11_((char *)local_a80,"resampler.attn.%s.%s","q","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x268) = pgVar8;
    std::__cxx11::string::~string(local_a80);
    string_format_abi_cxx11_((char *)local_aa0,"resampler.attn.%s.%s","k","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x278) = pgVar8;
    std::__cxx11::string::~string(local_aa0);
    string_format_abi_cxx11_((char *)local_ac0,"resampler.attn.%s.%s","v","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x288) = pgVar8;
    std::__cxx11::string::~string(local_ac0);
    string_format_abi_cxx11_((char *)local_ae0,"resampler.attn.%s.%s","q","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x270) = pgVar8;
    std::__cxx11::string::~string(local_ae0);
    string_format_abi_cxx11_((char *)local_b00,"resampler.attn.%s.%s","k","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x280) = pgVar8;
    std::__cxx11::string::~string(local_b00);
    string_format_abi_cxx11_((char *)local_b20,"resampler.attn.%s.%s","v","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x290) = pgVar8;
    std::__cxx11::string::~string(local_b20);
    string_format_abi_cxx11_((char *)local_b40,"resampler.attn.%s.%s","out","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x298) = pgVar8;
    std::__cxx11::string::~string(local_b40);
    string_format_abi_cxx11_((char *)local_b60,"resampler.attn.%s.%s","out","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2a0) = pgVar8;
    std::__cxx11::string::~string(local_b60);
    string_format_abi_cxx11_((char *)local_b80,"resampler.ln_%s.%s","q","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2a8) = pgVar8;
    std::__cxx11::string::~string(local_b80);
    string_format_abi_cxx11_((char *)local_ba0,"resampler.ln_%s.%s","q","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2b0) = pgVar8;
    std::__cxx11::string::~string(local_ba0);
    string_format_abi_cxx11_((char *)local_bc0,"resampler.ln_%s.%s","kv","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2b8) = pgVar8;
    std::__cxx11::string::~string(local_bc0);
    string_format_abi_cxx11_((char *)local_be0,"resampler.ln_%s.%s","kv","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2c0) = pgVar8;
    std::__cxx11::string::~string(local_be0);
    string_format_abi_cxx11_((char *)local_c00,"resampler.ln_%s.%s","post","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2c8) = pgVar8;
    std::__cxx11::string::~string(local_c00);
    string_format_abi_cxx11_((char *)local_c20,"resampler.ln_%s.%s","post","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2d0) = pgVar8;
    std::__cxx11::string::~string(local_c20);
    break;
  case 5:
    string_format_abi_cxx11_((char *)local_c40,"adapter.conv.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x148) = pgVar8;
    std::__cxx11::string::~string(local_c40);
    string_format_abi_cxx11_((char *)local_c60,"adapter.conv.%s","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x150) = pgVar8;
    std::__cxx11::string::~string(local_c60);
    string_format_abi_cxx11_((char *)local_c80,"adapter.linear.linear.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x218) = pgVar8;
    std::__cxx11::string::~string(local_c80);
    string_format_abi_cxx11_((char *)local_ca0,"adapter.linear.norm1.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2a8) = pgVar8;
    std::__cxx11::string::~string(local_ca0);
    string_format_abi_cxx11_((char *)local_cc0,"adapter.linear.norm1.%s","bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2b0) = pgVar8;
    std::__cxx11::string::~string(local_cc0);
    string_format_abi_cxx11_((char *)local_ce0,"adapter.linear.dense_h_to_4h.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x158) = pgVar8;
    std::__cxx11::string::~string(local_ce0);
    string_format_abi_cxx11_((char *)local_d00,"adapter.linear.gate.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x228) = pgVar8;
    std::__cxx11::string::~string(local_d00);
    string_format_abi_cxx11_((char *)local_d20,"adapter.linear.dense_4h_to_h.%s","weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x168) = pgVar8;
    std::__cxx11::string::~string(local_d20);
    break;
  case 6:
    string_format_abi_cxx11_((char *)local_d40,"mm.%d.%s",0,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0xf0) = pgVar8;
    std::__cxx11::string::~string(local_d40);
    string_format_abi_cxx11_((char *)local_d60,"mm.%d.%s",0,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0xf8) = pgVar8;
    std::__cxx11::string::~string(local_d60);
    string_format_abi_cxx11_((char *)local_d80,"mm.%d.%s",2,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x118) = pgVar8;
    std::__cxx11::string::~string(local_d80);
    string_format_abi_cxx11_((char *)local_da0,"mm.%d.%s",2,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x120) = pgVar8;
    std::__cxx11::string::~string(local_da0);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2d8) = pgVar8;
    std::__cxx11::string::~string(local_dc0);
    std::allocator<char>::~allocator(&local_dc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2e0) = pgVar8;
    std::__cxx11::string::~string(local_de8);
    std::allocator<char>::~allocator(&local_de9);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0xe8) = pgVar8;
    std::__cxx11::string::~string(local_e10);
    std::allocator<char>::~allocator(&local_e11);
    break;
  case 9:
    string_format_abi_cxx11_((char *)local_e38,"mm.%d.%s",1,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x118) = pgVar8;
    std::__cxx11::string::~string(local_e38);
    string_format_abi_cxx11_((char *)local_e58,"mm.%d.%s",1,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x120) = pgVar8;
    std::__cxx11::string::~string(local_e58);
    string_format_abi_cxx11_((char *)local_e78,"mm.%d.%s",2,"weight");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x100) = pgVar8;
    std::__cxx11::string::~string(local_e78);
    string_format_abi_cxx11_((char *)local_e98,"mm.%d.%s",2,"bias");
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x108) = pgVar8;
    std::__cxx11::string::~string(local_e98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pgVar8 = load_tensors::anon_class_16_2_dbf8b9d2::operator()
                       (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(bool)required);
    *(ggml_tensor **)(local_108 + 0x2e8) = pgVar8;
    std::__cxx11::string::~string(local_eb8);
    std::allocator<char>::~allocator(&local_eb9);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x6c3,"GGML_ASSERT(%s) failed","false && \"unknown projector type\"");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cfcb2);
  std::ifstream::ifstream(local_10e0,(string *)(in_RDI + 0x18),_S_bin);
  bVar2 = std::ios::operator!((ios *)((long)local_10e0 + *(long *)(local_10e0[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    local_1101 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar12 = std::__cxx11::string::c_str();
    string_format_abi_cxx11_((char *)local_1100,"%s: failed to open %s\n","load_tensors",uVar12);
    std::runtime_error::runtime_error(prVar7,local_1100);
    local_1101 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1110 = ggml_backend_get_default_buffer_type
                         (*(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x380));
  pgVar9 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                     ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar14,uVar13));
  ggml_backend_alloc_ctx_tensors_from_buft(pgVar9,local_1110);
  std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::reset
            ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)CONCAT44(uVar14,uVar13)
             ,(pointer)__p);
  pgVar10 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get
                      ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
                       CONCAT44(uVar14,uVar13));
  ggml_backend_buffer_set_usage(pgVar10,1);
  local_1118 = local_50;
  local_1120._M_current =
       (ggml_tensor **)
       std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin
                 ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)__p);
  local_1128 = (ggml_tensor **)
               std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end
                         ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)__p);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                        *)CONCAT44(uVar14,uVar13),
                       (__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                        *)__p);
    if (!bVar1) {
      std::ifstream::close();
      if ((int)g_logger_state.verbosity_thold < 2) {
        in_stack_ffffffffffffe9a0 =
             (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
             std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(local_50);
        uVar12 = std::__cxx11::string::c_str();
        clip_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: loaded %zu tensors from %s\n","load_tensors",
                          in_stack_ffffffffffffe9a0,uVar12);
      }
      std::ifstream::~ifstream(local_10e0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9a0)
      ;
      std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~vector(in_stack_ffffffffffffe9a0)
      ;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)0x1d02f5);
      return;
    }
    local_1130 = __gnu_cxx::
                 __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                 ::operator*(&local_1120);
    pgVar9 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                       ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uVar14,uVar13));
    local_1138 = ggml_get_tensor(pgVar9,(*local_1130)->name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,
               (char *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8),
               in_stack_ffffffffffffe9c0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_ffffffffffffe9d0,
                          (key_type *)CONCAT17(in_stack_ffffffffffffe9cf,in_stack_ffffffffffffe9c8))
    ;
    in_stack_ffffffffffffe9d0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pmVar6;
    std::__cxx11::string::~string(local_1160);
    std::allocator<char>::~allocator(&local_1161);
    local_1140 = in_stack_ffffffffffffe9d0;
    std::istream::seekg((long)local_10e0,(_Ios_Seekdir)in_stack_ffffffffffffe9d0);
    in_stack_ffffffffffffe9cf =
         std::ios::operator!((ios *)((long)local_10e0 + *(long *)(local_10e0[0] + -0x18)));
    if ((in_stack_ffffffffffffe9cf & 1) != 0) break;
    uVar12 = ggml_nbytes(local_1138);
    bVar2 = ggml_backend_buft_is_host(local_1110);
    if ((bVar2 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(bVar2,in_stack_ffffffffffffe9b0),in_stack_ffffffffffffe9a8);
      puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d01ee);
      std::istream::read((char *)local_10e0,(long)puVar11);
      in_stack_ffffffffffffe9a8 = local_1138;
      puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d0222);
      ggml_backend_tensor_set(in_stack_ffffffffffffe9a8,puVar11,0,uVar12);
    }
    else {
      std::istream::read((char *)local_10e0,*(long *)(local_1138 + 0xf8));
    }
    __gnu_cxx::
    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>::
    operator++(&local_1120);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  string_format_abi_cxx11_
            ((char *)local_1188,"%s: failed to seek for tensor %s\n","load_tensors",
             (*local_1130)->name);
  std::runtime_error::runtime_error(prVar7,local_1188);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_tensors() {
        std::map<std::string, size_t> tensor_offset;
        std::vector<ggml_tensor *> tensors_to_load;

        // get offsets
        for (int64_t i = 0; i < gguf_get_n_tensors(ctx_gguf.get()); ++i) {
            const char * name = gguf_get_tensor_name(ctx_gguf.get(), i);
            tensor_offset[name] = gguf_get_data_offset(ctx_gguf.get()) + gguf_get_tensor_offset(ctx_gguf.get(), i);
        }

        // create data context
        struct ggml_init_params params = {
            /*.mem_size =*/ (gguf_get_n_tensors(ctx_gguf.get()) + 1) * ggml_tensor_overhead(),
            /*.mem_buffer =*/ NULL,
            /*.no_alloc =*/ true,
        };
        ctx_clip.ctx_data.reset(ggml_init(params));
        if (!ctx_clip.ctx_data) {
            throw std::runtime_error(string_format("%s: failed to init ggml context\n", __func__));
        }

        // helper function
        auto get_tensor = [&](const std::string & name, bool required = true) {
            struct ggml_tensor * cur = ggml_get_tensor(ctx_meta.get(), name.c_str());
            if (!cur && required) {
                throw std::runtime_error(string_format("%s: unable to find tensor %s\n", __func__, name.c_str()));
            }
            if (cur) {
                tensors_to_load.push_back(cur);
                // add tensors to context
                struct ggml_tensor * data_tensor = ggml_dup_tensor(ctx_clip.ctx_data.get(), cur);
                ggml_set_name(data_tensor, cur->name);
                cur = data_tensor;
            }
            return cur;
        };

        auto & vision_model = ctx_clip.vision_model;

        vision_model.class_embedding = get_tensor(TN_CLASS_EMBD, false);

        vision_model.pre_ln_w = get_tensor(string_format(TN_LN_PRE, "v", "weight"), false);
        vision_model.pre_ln_b = get_tensor(string_format(TN_LN_PRE, "v", "bias"),   false);

        vision_model.post_ln_w = get_tensor(string_format(TN_LN_POST, "v", "weight"), false);
        vision_model.post_ln_b = get_tensor(string_format(TN_LN_POST, "v", "bias"),   false);

        vision_model.patch_bias = get_tensor(TN_PATCH_BIAS, false);
        vision_model.patch_embeddings_0 = get_tensor(TN_PATCH_EMBD,   false);
        vision_model.patch_embeddings_1 = get_tensor(TN_PATCH_EMBD_1, false);
        if (vision_model.patch_embeddings_1 == nullptr) {
            ctx_clip.has_qwen2vl_merger = false;
        }

        vision_model.position_embeddings = get_tensor(string_format(TN_POS_EMBD, "v"), false);

        // layers
        vision_model.layers.resize(vision_model.hparams.n_layer);
        for (int il = 0; il < vision_model.hparams.n_layer; ++il) {
            auto & layer = vision_model.layers[il];
            layer.k_w    = get_tensor(string_format(TN_ATTN_K,      "v", il, "weight"));
            layer.q_w    = get_tensor(string_format(TN_ATTN_Q,      "v", il, "weight"));
            layer.v_w    = get_tensor(string_format(TN_ATTN_V,      "v", il, "weight"));
            layer.o_w    = get_tensor(string_format(TN_ATTN_OUTPUT, "v", il, "weight"));
            layer.ln_1_w = get_tensor(string_format(TN_LN_1,        "v", il, "weight"), false);
            layer.ln_2_w = get_tensor(string_format(TN_LN_2,        "v", il, "weight"), false);
            layer.k_b    = get_tensor(string_format(TN_ATTN_K,      "v", il, "bias"), false);
            layer.q_b    = get_tensor(string_format(TN_ATTN_Q,      "v", il, "bias"), false);
            layer.v_b    = get_tensor(string_format(TN_ATTN_V,      "v", il, "bias"), false);
            layer.o_b    = get_tensor(string_format(TN_ATTN_OUTPUT, "v", il, "bias"), false);
            layer.ln_1_b = get_tensor(string_format(TN_LN_1,        "v", il, "bias"), false);
            layer.ln_2_b = get_tensor(string_format(TN_LN_2,        "v", il, "bias"), false);

            // new naming
            layer.ff_up_w   = get_tensor(string_format(TN_FFN_UP,   "v", il, "weight"));
            layer.ff_up_b   = get_tensor(string_format(TN_FFN_UP,   "v", il, "bias"),   false);
            layer.ff_gate_w = get_tensor(string_format(TN_FFN_GATE, "v", il, "weight"), false);
            layer.ff_gate_b = get_tensor(string_format(TN_FFN_GATE, "v", il, "bias"),   false);
            layer.ff_down_w = get_tensor(string_format(TN_FFN_DOWN, "v", il, "weight"));
            layer.ff_down_b = get_tensor(string_format(TN_FFN_DOWN, "v", il, "bias"),   false);

            // legacy naming (the in and out is reversed! don't ask me why)
            layer.ff_i_w = layer.ff_down_w;
            layer.ff_o_w = layer.ff_up_w;
            layer.ff_i_b = layer.ff_down_b;
            layer.ff_o_b = layer.ff_up_b;
        }

        switch (ctx_clip.proj_type) {
            case PROJECTOR_TYPE_MLP:
            case PROJECTOR_TYPE_MLP_NORM:
                {
                    // LLaVA projection
                    vision_model.mm_0_w = get_tensor(string_format(TN_LLAVA_PROJ, 0, "weight"), false);
                    vision_model.mm_0_b = get_tensor(string_format(TN_LLAVA_PROJ, 0, "bias"), false);
                    // Yi-type llava
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 1, "weight"), false);
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 1, "bias"), false);
                    // missing in Yi-type llava
                    vision_model.mm_2_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"), false);
                    vision_model.mm_2_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"), false);
                    // Yi-type llava
                    vision_model.mm_3_w = get_tensor(string_format(TN_LLAVA_PROJ, 3, "weight"), false);
                    vision_model.mm_3_b = get_tensor(string_format(TN_LLAVA_PROJ, 3, "bias"), false);
                    vision_model.mm_4_w = get_tensor(string_format(TN_LLAVA_PROJ, 4, "weight"), false);
                    vision_model.mm_4_b = get_tensor(string_format(TN_LLAVA_PROJ, 4, "bias"), false);
                    if (vision_model.mm_3_w) {
                        // TODO: this is a hack to support Yi-type llava
                        ctx_clip.proj_type = PROJECTOR_TYPE_MLP_NORM;
                    }
                    vision_model.image_newline = get_tensor(TN_IMAGE_NEWLINE, false);
                } break;
            case PROJECTOR_TYPE_LDP:
                {
                    // MobileVLM projection
                    vision_model.mm_model_mlp_1_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 1, "weight"));
                    vision_model.mm_model_mlp_1_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 1, "bias"));
                    vision_model.mm_model_mlp_3_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 3, "weight"));
                    vision_model.mm_model_mlp_3_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 3, "bias"));
                    vision_model.mm_model_block_1_block_0_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "0.weight"));
                    vision_model.mm_model_block_1_block_0_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "1.weight"));
                    vision_model.mm_model_block_1_block_0_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 0, "1.bias"));
                    vision_model.mm_model_block_1_block_1_fc1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc1.weight"));
                    vision_model.mm_model_block_1_block_1_fc1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc1.bias"));
                    vision_model.mm_model_block_1_block_1_fc2_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc2.weight"));
                    vision_model.mm_model_block_1_block_1_fc2_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 1, "fc2.bias"));
                    vision_model.mm_model_block_1_block_2_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "0.weight"));
                    vision_model.mm_model_block_1_block_2_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "1.weight"));
                    vision_model.mm_model_block_1_block_2_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 1, 2, "1.bias"));
                    vision_model.mm_model_block_2_block_0_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "0.weight"));
                    vision_model.mm_model_block_2_block_0_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "1.weight"));
                    vision_model.mm_model_block_2_block_0_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 0, "1.bias"));
                    vision_model.mm_model_block_2_block_1_fc1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc1.weight"));
                    vision_model.mm_model_block_2_block_1_fc1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc1.bias"));
                    vision_model.mm_model_block_2_block_1_fc2_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc2.weight"));
                    vision_model.mm_model_block_2_block_1_fc2_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 1, "fc2.bias"));
                    vision_model.mm_model_block_2_block_2_0_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "0.weight"));
                    vision_model.mm_model_block_2_block_2_1_w = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "1.weight"));
                    vision_model.mm_model_block_2_block_2_1_b = get_tensor(string_format(TN_MVLM_PROJ_BLOCK, 2, 2, "1.bias"));
                } break;
            case PROJECTOR_TYPE_LDPV2:
                {
                    // MobilVLM_V2 projection
                    vision_model.mm_model_mlp_0_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 0, "weight"));
                    vision_model.mm_model_mlp_0_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 0, "bias"));
                    vision_model.mm_model_mlp_2_w = get_tensor(string_format(TN_MVLM_PROJ_MLP, 2, "weight"));
                    vision_model.mm_model_mlp_2_b = get_tensor(string_format(TN_MVLM_PROJ_MLP, 2, "bias"));
                    vision_model.mm_model_peg_0_w = get_tensor(string_format(TN_MVLM_PROJ_PEG, 0, "weight"));
                    vision_model.mm_model_peg_0_b = get_tensor(string_format(TN_MVLM_PROJ_PEG, 0, "bias"));
                } break;
            case PROJECTOR_TYPE_RESAMPLER:
                {
                    // vision_model.mm_model_pos_embed = get_tensor(new_clip->ctx_data, TN_MINICPMV_POS_EMBD);
                    vision_model.mm_model_pos_embed_k = get_tensor(TN_MINICPMV_POS_EMBD_K);
                    vision_model.mm_model_query = get_tensor(TN_MINICPMV_QUERY);
                    vision_model.mm_model_proj = get_tensor(TN_MINICPMV_PROJ);
                    vision_model.mm_model_kv_proj = get_tensor(TN_MINICPMV_KV_PROJ);
                    vision_model.mm_model_attn_q_w = get_tensor(string_format(TN_MINICPMV_ATTN, "q", "weight"));
                    vision_model.mm_model_attn_k_w = get_tensor(string_format(TN_MINICPMV_ATTN, "k", "weight"));
                    vision_model.mm_model_attn_v_w = get_tensor(string_format(TN_MINICPMV_ATTN, "v", "weight"));
                    vision_model.mm_model_attn_q_b = get_tensor(string_format(TN_MINICPMV_ATTN, "q", "bias"));
                    vision_model.mm_model_attn_k_b = get_tensor(string_format(TN_MINICPMV_ATTN, "k", "bias"));
                    vision_model.mm_model_attn_v_b = get_tensor(string_format(TN_MINICPMV_ATTN, "v", "bias"));
                    vision_model.mm_model_attn_o_w = get_tensor(string_format(TN_MINICPMV_ATTN, "out", "weight"));
                    vision_model.mm_model_attn_o_b = get_tensor(string_format(TN_MINICPMV_ATTN, "out", "bias"));
                    vision_model.mm_model_ln_q_w = get_tensor(string_format(TN_MINICPMV_LN, "q", "weight"));
                    vision_model.mm_model_ln_q_b = get_tensor(string_format(TN_MINICPMV_LN, "q", "bias"));
                    vision_model.mm_model_ln_kv_w = get_tensor(string_format(TN_MINICPMV_LN, "kv", "weight"));
                    vision_model.mm_model_ln_kv_b = get_tensor(string_format(TN_MINICPMV_LN, "kv", "bias"));
                    vision_model.mm_model_ln_post_w = get_tensor(string_format(TN_MINICPMV_LN, "post", "weight"));
                    vision_model.mm_model_ln_post_b = get_tensor(string_format(TN_MINICPMV_LN, "post", "bias"));
                } break;
            case PROJECTOR_TYPE_GLM_EDGE:
                {
                    vision_model.mm_model_adapter_conv_w = get_tensor(string_format(TN_GLM_ADAPER_CONV, "weight"));
                    vision_model.mm_model_adapter_conv_b = get_tensor(string_format(TN_GLM_ADAPER_CONV, "bias"));
                    vision_model.mm_model_mlp_0_w = get_tensor(string_format(TN_GLM_ADAPTER_LINEAR,"weight"));
                    vision_model.mm_model_ln_q_w = get_tensor(string_format(TN_GLM_ADAPTER_NORM_1,"weight"));
                    vision_model.mm_model_ln_q_b = get_tensor(string_format(TN_GLM_ADAPTER_NORM_1,"bias"));
                    vision_model.mm_model_mlp_1_w = get_tensor(string_format(TN_GLM_ADAPTER_D_H_2_4H,"weight"));
                    vision_model.mm_model_mlp_2_w = get_tensor(string_format(TN_GLM_ADAPTER_GATE,"weight"));
                    vision_model.mm_model_mlp_3_w = get_tensor(string_format(TN_GLM_ADAPTER_D_4H_2_H,"weight"));
                } break;
            case PROJECTOR_TYPE_MERGER:
                {
                    vision_model.mm_0_w = get_tensor(string_format(TN_LLAVA_PROJ, 0, "weight"));
                    vision_model.mm_0_b = get_tensor(string_format(TN_LLAVA_PROJ, 0, "bias"));
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"));
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"));
                } break;
            case PROJECTOR_TYPE_GEMMA3:
                {
                    vision_model.mm_input_proj_w = get_tensor(TN_MM_INP_PROJ);
                    vision_model.mm_soft_emb_norm_w = get_tensor(TN_MM_SOFT_EMB_N);
                } break;
            case PROJECTOR_TYPE_IDEFICS3:
                {
                    vision_model.projection = get_tensor(TN_MM_PROJECTOR);
                } break;
            case PROJECTOR_TYPE_PIXTRAL:
                {
                    vision_model.mm_1_w = get_tensor(string_format(TN_LLAVA_PROJ, 1, "weight"));
                    vision_model.mm_1_b = get_tensor(string_format(TN_LLAVA_PROJ, 1, "bias"));
                    vision_model.mm_2_w = get_tensor(string_format(TN_LLAVA_PROJ, 2, "weight"));
                    vision_model.mm_2_b = get_tensor(string_format(TN_LLAVA_PROJ, 2, "bias"));
                    // [IMG_BREAK] token embedding
                    vision_model.token_embd_img_break = get_tensor(TN_TOK_IMG_BREAK);
                } break;
            default:
                GGML_ASSERT(false && "unknown projector type");
        }

        // load data
        {
            std::vector<uint8_t> read_buf;

            auto fin = std::ifstream(fname, std::ios::binary);
            if (!fin) {
                throw std::runtime_error(string_format("%s: failed to open %s\n", __func__, fname.c_str()));
            }

            // alloc memory and offload data
            ggml_backend_buffer_type_t buft = ggml_backend_get_default_buffer_type(ctx_clip.backend);
            ctx_clip.buf.reset(ggml_backend_alloc_ctx_tensors_from_buft(ctx_clip.ctx_data.get(), buft));
            ggml_backend_buffer_set_usage(ctx_clip.buf.get(), GGML_BACKEND_BUFFER_USAGE_WEIGHTS);
            for (auto & t : tensors_to_load) {
                struct ggml_tensor * cur = ggml_get_tensor(ctx_clip.ctx_data.get(), t->name);
                const size_t offset = tensor_offset[t->name];
                fin.seekg(offset, std::ios::beg);
                if (!fin) {
                    throw std::runtime_error(string_format("%s: failed to seek for tensor %s\n", __func__, t->name));
                }
                size_t num_bytes = ggml_nbytes(cur);
                if (ggml_backend_buft_is_host(buft)) {
                    // for the CPU and Metal backend, we can read directly into the tensor
                    fin.read(reinterpret_cast<char *>(cur->data), num_bytes);
                } else {
                    // read into a temporary buffer first, then copy to device memory
                    read_buf.resize(num_bytes);
                    fin.read(reinterpret_cast<char *>(read_buf.data()), num_bytes);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, num_bytes);
                }
            }
            fin.close();

            LOG_DBG("%s: loaded %zu tensors from %s\n", __func__, tensors_to_load.size(), fname.c_str());
        }
    }